

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualengine.cpp
# Opt level: O3

void __thiscall QualEngine::solve(QualEngine *this,int tstep)

{
  pointer piVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar6;
  
  if ((tstep != 0) && (this->engineState == INITIALIZED)) {
    uVar6 = (ulong)(uint)tstep;
    if (this->qualTime == 0) {
      setFlowDirections(this);
      if (0 < this->linkCount) {
        piVar1 = (this->sortedLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = 0;
        do {
          piVar1[lVar3] = (int)lVar3;
          lVar3 = lVar3 + 1;
        } while (lVar3 < this->linkCount);
      }
    }
    else {
      bVar2 = flowDirectionsChanged(this);
      if ((bVar2) && (setFlowDirections(this), 0 < this->linkCount)) {
        piVar1 = (this->sortedLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = 0;
        do {
          piVar1[lVar3] = (int)lVar3;
          lVar3 = lVar3 + 1;
        } while (lVar3 < this->linkCount);
      }
    }
    setSourceQuality(this);
    this->qualTime = this->qualTime + tstep;
    if (0 < tstep) {
      do {
        iVar4 = (int)uVar6;
        uVar7 = (ulong)(uint)this->qualStep;
        if (iVar4 < this->qualStep) {
          uVar7 = uVar6;
        }
        (*this->qualSolver->_vptr_QualSolver[4])
                  (this->qualSolver,
                   (this->sortedLinks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,uVar7);
        uVar5 = iVar4 - (int)uVar7;
        uVar6 = (ulong)uVar5;
      } while (uVar5 != 0 && (int)uVar7 <= iVar4);
    }
  }
  return;
}

Assistant:

void QualEngine::solve(int tstep)
{
    // ... check that engine has been initialized

    if ( engineState != QualEngine::INITIALIZED ) return;
    if ( tstep == 0 ) return;

   // ... topologically sort the links if flow direction has changed

    if ( qualTime == 0 ) sortLinks();
    else if ( flowDirectionsChanged() ) sortLinks();

    // ... determine external source quality

    setSourceQuality();

    // ... propagate water quality through network over a sequence
    //     of water quality time steps

    qualTime += tstep;

    while ( tstep > 0 )
    {
        int qstep = min(qualStep, tstep);
        qualSolver->solve(&sortedLinks[0], qstep);
        tstep -= qstep;
    }
}